

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeDriverRTASFormatCompatibilityCheckExtPrologue
          (ZEParameterValidation *this,ze_driver_handle_t hDriver,ze_rtas_format_ext_t rtasFormatA,
          ze_rtas_format_ext_t rtasFormatB)

{
  ze_result_t zVar1;
  
  if (hDriver != (ze_driver_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION;
    if (rtasFormatA != ZE_RTAS_FORMAT_EXT_FORCE_UINT32) {
      zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION;
      if (rtasFormatB != ZE_RTAS_FORMAT_EXT_FORCE_UINT32) {
        zVar1 = ZE_RESULT_SUCCESS;
      }
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeDriverRTASFormatCompatibilityCheckExtPrologue(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        ze_rtas_format_ext_t rtasFormatA,               ///< [in] operand A
        ze_rtas_format_ext_t rtasFormatB                ///< [in] operand B
        )
    {
        if( nullptr == hDriver )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( ZE_RTAS_FORMAT_EXT_MAX < rtasFormatA )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_RTAS_FORMAT_EXT_MAX < rtasFormatB )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ZE_RESULT_SUCCESS;
    }